

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O2

UINT8 device_start_c352(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  UINT8 UVar2;
  DEV_DATA chip;
  long lVar3;
  short sVar4;
  short sVar5;
  ulong uVar6;
  
  chip.chipInf = calloc(1,0x6a8);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    UVar2 = 0xff;
  }
  else {
    *(uint *)&((DEV_DATA *)((long)chip.chipInf + 8))->chipInf = cfg->clock / 0x120;
    *(UINT8 *)&((DEV_DATA *)((long)chip.chipInf + 0x4a0))->chipInf = cfg->flags;
    c352_set_mute_mask(chip.chipInf,0);
    sVar4 = 0;
    for (uVar6 = 0; uVar6 != 0x80; uVar6 = uVar6 + 1) {
      *(short *)((long)chip.chipInf + uVar6 * 2 + 0x4a2) = sVar4 << 5;
      sVar5 = 1;
      if (((0xf < uVar6) && (sVar5 = 2, 0x17 < uVar6)) && (sVar5 = 4, 0x2f < uVar6)) {
        sVar5 = (ushort)(99 < uVar6) * 8 + 8;
      }
      sVar4 = sVar4 + sVar5;
    }
    for (lVar3 = 0x2d1; lVar3 != 0x351; lVar3 = lVar3 + 1) {
      *(ushort *)((long)chip.chipInf + lVar3 * 2) =
           ~*(ushort *)((long)chip.chipInf + lVar3 * 2 + -0x100) & 0xffe0;
    }
    *(void **)chip.chipInf = chip.chipInf;
    UVar1 = *(UINT32 *)((long)chip.chipInf + 8);
    retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
    retDevInf->sampleRate = UVar1;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
    UVar2 = '\0';
  }
  return UVar2;
}

Assistant:

static UINT8 device_start_c352(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	C352 *c;
	int i;
	INT16 j;

	c = (C352 *)calloc(1, sizeof(C352));
	if (c == NULL)
		return 0xFF;

	c->wave = NULL;
	c->wavesize = 0x00;

	//c->sample_rate_base = cfg->clock / 576;	// sample rate according to superctr
	c->sample_rate_base = cfg->clock / 288;	// TODO: output at 43 KHz and fix sample reading/interpolation code
	c->muteRear = cfg->flags;

	//device_reset_c352(c);

	c352_set_mute_mask(c, 0x00000000);
	
	j=0;
	for(i=0;i<128;i++)
	{
		c->mulaw_table[i] = j<<5;
		if(i < 16)
			j += 1;
		else if(i < 24)
			j += 2;
		else if(i < 48)
			j += 4;
		else if(i < 100)
			j += 8;
		else
			j += 16;
	}
	for(i=128;i<256;i++)
		c->mulaw_table[i] = (~c->mulaw_table[i-128])&~0x1f;

	c->_devData.chipInf = c;
	INIT_DEVINF(retDevInf, &c->_devData, c->sample_rate_base, &devDef);
	return 0x00;
}